

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O2

zt_log_ty * zt_log_get_logger(void)

{
  if (log_default_ptr == (zt_log_ty *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&log_mutex);
    if (log_default_ptr == (zt_log_ty *)0x0) {
      log_default_ptr = zt_log_stderr(2);
      if (log_default_ptr == (zt_log_ty *)0x0) {
        fwrite("Could not allocate stderr for logging\n",0x26,1,_stderr);
        exit(1);
      }
      zt_atexit(log_atexit,log_default_ptr);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&log_mutex);
  }
  return log_default_ptr;
}

Assistant:

static zt_log_ty *
zt_log_get_logger(void) {
    if (!log_default_ptr) {
#ifdef HAVE_PTHREADS
        pthread_mutex_lock(&log_mutex);
#endif
        /* second check is just to avoid having to have a mutex lock
         * around the default case of a logger being set
         */
        if (!log_default_ptr) {
            if ((log_default_ptr = zt_log_stderr(ZT_LOG_WITH_LEVEL)) == NULL) {
                fprintf(stderr, "Could not allocate stderr for logging\n");
                exit(1);
            }
            forced = 1;
            zt_atexit(log_atexit, log_default_ptr);
        }
#ifdef HAVE_PTHREADS
        pthread_mutex_unlock(&log_mutex);
#endif
    }

    return log_default_ptr;
}